

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions.cpp
# Opt level: O1

void chip8::instructions::rnd_reg_byte(registers *regs,instr_t instr)

{
  result_type rVar1;
  uint uVar2;
  uint uVar3;
  default_random_engine engine;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_13a0;
  anon_union_5000_2_650ea050_for_random_device_0 local_1398;
  
  std::random_device::random_device((random_device *)&local_1398.field_0);
  uVar2 = std::random_device::_M_getval();
  uVar3 = uVar2 / 0x7fffffff << 0x1f | uVar2 / 0x7fffffff;
  local_13a0._M_x = (unsigned_long)(uVar3 + uVar2 + (uint)(uVar2 + uVar3 == 0));
  std::random_device::_M_fini();
  local_1398._0_4_ = 0xff0000;
  rVar1 = std::uniform_int_distribution<unsigned_short>::operator()
                    ((uniform_int_distribution<unsigned_short> *)&local_1398.field_0,&local_13a0,
                     (param_type *)&local_1398);
  (regs->v)._M_elems[(ushort)instr._M_elems & 0xf] = (byte)rVar1 & instr._M_elems[1];
  return;
}

Assistant:

void instructions::rnd_reg_byte(chip8::registers& regs, instr_t instr) noexcept
{
	const auto x_offset = instructions::get_lower_nibble<size_t>(instr[0]);

	auto engine = std::default_random_engine{std::random_device{}()};
	auto random_number = std::uniform_int_distribution<uint16_t>(0, 255)(engine);

	regs.v[x_offset] = std::byte(random_number) & instr[1];
}